

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_vcf_by_region.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  htsFile *hfp;
  runtime_error *prVar2;
  bcf_hdr_t *hdr;
  bcf_srs_t *readers;
  ostream *poVar3;
  char *pcVar4;
  bcf1_t *local_60;
  bcf1_t *line;
  bcf_srs_t *sr;
  bcf_hdr_t *test_header;
  htsFile *test_bcf;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    hfp = hts_open(argv[1],"r");
    if (hfp == (htsFile *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unable to open file.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    hdr = bcf_hdr_read(hfp);
    if (hdr == (bcf_hdr_t *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unable to read header.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    readers = bcf_sr_init();
    bcf_sr_set_regions(readers,argv[2],0);
    bcf_sr_add_reader(readers,argv[1]);
    poVar3 = std::operator<<((ostream *)&std::cout,"chromosome\tposition\tnum_alleles");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    while( true ) {
      iVar1 = bcf_sr_next_line(readers);
      if (iVar1 == 0) break;
      if (*readers->has_line == 0) {
        local_60 = (bcf1_t *)0x0;
      }
      else {
        local_60 = *readers->readers->buffer;
      }
      pcVar4 = bcf_hdr_id2name(hdr,local_60->rid);
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_60->pos);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(uint)((ulong)*(undefined8 *)&local_60->field_0x10 >> 0x10) &
                                 0xffff);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    bcf_sr_destroy(readers);
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = usage();
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if(argc == 3) {
        //init
        htsFile *test_bcf = NULL;
        bcf_hdr_t *test_header = NULL;
        test_bcf = bcf_open(argv[1], "r");
        if(test_bcf == NULL) {
            throw std::runtime_error("Unable to open file.");
        }
        test_header = bcf_hdr_read(test_bcf);
        if(test_header == NULL) {
            throw std::runtime_error("Unable to read header.");
        }

        bcf_srs_t *sr = bcf_sr_init();
        bcf_sr_set_regions(sr, argv[2], 0);
        bcf_sr_add_reader(sr, argv[1]);
        std::cout << "chromosome\tposition\tnum_alleles" << std::endl;
        while (bcf_sr_next_line(sr)) {
            bcf1_t *line = bcf_sr_get_line(sr, 0);
            cout << bcf_hdr_id2name(test_header, line->rid) \
                 << "\t" << line->pos \
                 << "\t" << line->n_allele << endl;
        }
        bcf_sr_destroy(sr);
    } else {
        return usage();
    }
    return 0;
}